

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form3_Transpose(TransposeForm3 Transpose)

{
  bool bVar1;
  uint height_;
  code *in_RDI;
  Image output;
  uint32_t roiHeight;
  uint32_t roiWidth;
  uint32_t roiY;
  uint32_t roiX;
  Image input;
  uint8_t intensity;
  uint32_t in_stack_ffffffffffffff38;
  uint32_t in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff44;
  undefined1 in_stack_ffffffffffffff45;
  uint8_t in_stack_ffffffffffffff46;
  byte bVar2;
  uint8_t in_stack_ffffffffffffff47;
  undefined4 uVar3;
  ImageTemplate<unsigned_char> *this;
  Image *in_stack_ffffffffffffff58;
  uint32_t in_stack_ffffffffffffff64;
  uint32_t in_stack_ffffffffffffff68;
  uint8_t in_stack_ffffffffffffff6f;
  undefined4 local_7c;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  ImageTemplate<unsigned_char> local_60;
  undefined1 local_38 [47];
  byte local_9;
  code *local_8;
  
  local_8 = in_RDI;
  local_9 = Unit_Test::intensityValue();
  height_ = (uint)local_9;
  this = &local_60;
  uVar3 = 0;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (this,0,height_,in_stack_ffffffffffffff47,in_stack_ffffffffffffff46);
  Test_Helper::uniformImage
            (in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
             in_stack_ffffffffffffff58);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e5ebf);
  Unit_Test::generateRoi
            (this,(uint32_t *)CONCAT44(uVar3,height_),
             (uint32_t *)
             CONCAT17(in_stack_ffffffffffffff47,
                      CONCAT16(in_stack_ffffffffffffff46,
                               CONCAT15(in_stack_ffffffffffffff45,
                                        CONCAT14(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40
                                                )))),
             (uint32_t *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             (uint32_t *)0x1e5ee0);
  (*local_8)(&stack0xffffffffffffff58,local_38,local_70,local_74,local_78,local_7c);
  bVar1 = Unit_Test::equalSize
                    ((Image *)CONCAT17(in_stack_ffffffffffffff47,
                                       CONCAT16(in_stack_ffffffffffffff46,
                                                CONCAT15(in_stack_ffffffffffffff45,
                                                         CONCAT14(in_stack_ffffffffffffff44,
                                                                  in_stack_ffffffffffffff40)))),
                     in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
  bVar2 = false;
  if (bVar1) {
    bVar2 = Unit_Test::verifyImage
                      ((Image *)CONCAT17(bVar1,(uint7)CONCAT15(in_stack_ffffffffffffff45,
                                                               CONCAT14(in_stack_ffffffffffffff44,
                                                                        in_stack_ffffffffffffff40)))
                       ,(uint8_t)(in_stack_ffffffffffffff3c >> 0x18));
  }
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e5f6a);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e5f77);
  return (bool)(bVar2 & 1);
}

Assistant:

bool form3_Transpose(TransposeForm3 Transpose)
    {
        const uint8_t intensity = intensityValue();
        const PenguinV_Image::Image input = uniformImage( intensity );

        uint32_t roiX, roiY, roiWidth, roiHeight;
        generateRoi( input, roiX, roiY, roiWidth, roiHeight );

        PenguinV_Image::Image output = Transpose( input, roiX, roiY, roiWidth, roiHeight );

        return equalSize( output, roiHeight, roiWidth )&& verifyImage( output, intensity );
    }